

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O1

SliceRange __thiscall soul::AST::ArrayElementRef::getResolvedSliceRange(ArrayElementRef *this)

{
  Expression *pEVar1;
  bool bVar2;
  ArraySize AVar3;
  ArraySize AVar4;
  SliceRange SVar5;
  Type type;
  pool_ptr<soul::AST::Constant> c_1;
  byte local_48;
  undefined7 uStack_47;
  int local_40;
  Structure *local_38;
  long local_30;
  PackedData local_28;
  
  bVar2 = isSliceRangeValid(this);
  if (!bVar2) {
    throwInternalCompilerError("isSliceRangeValid()","getResolvedSliceRange",0x9a4);
  }
  pEVar1 = (this->startIndex).object;
  if (pEVar1 == (Expression *)0x0) {
LAB_001dcc52:
    throwInternalCompilerError("object != nullptr","operator->",0x3c);
  }
  (*(pEVar1->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_48);
  if (CONCAT71(uStack_47,local_48) == 0) {
    AVar3 = 0;
  }
  else {
    soul::Value::getData(&local_28,(Value *)(CONCAT71(uStack_47,local_48) + 0x30));
    AVar3 = soul::Value::PackedData::getAsInt64(&local_28);
  }
  pEVar1 = (this->object).object;
  if (pEVar1 == (Expression *)0x0) goto LAB_001dcc52;
  (*(pEVar1->super_Statement).super_ASTObject._vptr_ASTObject[4])(&local_48);
  pEVar1 = (this->endIndex).object;
  if (pEVar1 == (Expression *)0x0) {
    if ((local_48 & 0xfe) != 2) goto LAB_001dcc6a;
    AVar4 = (ArraySize)local_40;
  }
  else {
    (*(pEVar1->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_30);
    if (local_30 == 0) {
      AVar4 = 0;
    }
    else {
      soul::Value::getData(&local_28,(Value *)(local_30 + 0x30));
      AVar4 = soul::Value::PackedData::getAsInt64(&local_28);
    }
  }
  if ((long)AVar3 < 0) {
    if ((local_48 & 0xfe) != 2) goto LAB_001dcc6a;
    AVar3 = AVar3 + (long)local_40;
  }
  if ((long)AVar4 < 0) {
    if ((local_48 & 0xfe) != 2) {
LAB_001dcc6a:
      throwInternalCompilerError("isArrayOrVector()","getArrayOrVectorSize",0x137);
    }
    AVar4 = AVar4 + (long)local_40;
  }
  RefCountedPtr<soul::Structure>::decIfNotNull(local_38);
  SVar5.end = AVar4;
  SVar5.start = AVar3;
  return SVar5;
}

Assistant:

SliceRange getResolvedSliceRange() const
        {
            SOUL_ASSERT (isSliceRangeValid());
            int64_t start = 0, end = 0;

            if (auto c = startIndex->getAsConstant())
                start = c->value.getAsInt64();

            auto type = object->getResultType();

            if (endIndex == nullptr)
                end = (int64_t) type.getArrayOrVectorSize();
            else if (auto c = endIndex->getAsConstant())
                end = c->value.getAsInt64();

            return { type.convertArrayOrVectorIndexToValidRange (start),
                     type.convertArrayOrVectorIndexToValidRange (end) };
        }